

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_lpc_swb.c
# Opt level: O2

int16_t WebRtcIsac_RemoveLarMean(double *lar,int16_t bandwidth)

{
  ushort uVar1;
  double *pdVar2;
  ushort uVar3;
  int iVar4;
  undefined6 in_register_00000032;
  long lVar5;
  
  iVar4 = (int)CONCAT62(in_register_00000032,bandwidth);
  if (iVar4 == 0xc) {
    pdVar2 = WebRtcIsac_kMeanLarUb12;
    uVar1 = 2;
  }
  else {
    if (iVar4 != 0x10) {
      return -1;
    }
    pdVar2 = WebRtcIsac_kMeanLarUb16;
    uVar1 = 4;
  }
  for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
    for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 8) {
      *(double *)((long)lar + lVar5) =
           *(double *)((long)lar + lVar5) - *(double *)((long)pdVar2 + lVar5);
    }
    lar = lar + 4;
  }
  return 0;
}

Assistant:

int16_t
WebRtcIsac_RemoveLarMean(
    double* lar,
    int16_t bandwidth)
{
  int16_t coeffCntr;
  int16_t vecCntr;
  int16_t numVec;
  const double* meanLAR;
  switch(bandwidth)
  {
    case isac12kHz:
      {
        numVec = UB_LPC_VEC_PER_FRAME;
        meanLAR = WebRtcIsac_kMeanLarUb12;
        break;
      }
    case isac16kHz:
      {
        numVec = UB16_LPC_VEC_PER_FRAME;
        meanLAR = WebRtcIsac_kMeanLarUb16;
        break;
      }
    default:
      return -1;
  }

  for(vecCntr = 0; vecCntr < numVec; vecCntr++)
  {
    for(coeffCntr = 0; coeffCntr < UB_LPC_ORDER; coeffCntr++)
    {
      // REMOVE MEAN
      *lar++ -= meanLAR[coeffCntr];
    }
  }
  return 0;
}